

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

Type * __thiscall soul::AST::TypeCast::getResultType(Type *__return_storage_ptr__,TypeCast *this)

{
  TypeCast *this_local;
  
  Type::Type(__return_storage_ptr__,&this->targetType);
  return __return_storage_ptr__;
}

Assistant:

Type getResultType() const override          { return targetType; }